

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O2

void __thiscall
BamTools::SamProgramChain::Add
          (SamProgramChain *this,
          vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_> *programs)

{
  pointer pSVar1;
  pointer program;
  
  pSVar1 = (programs->
           super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (program = (programs->
                 super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>).
                 _M_impl.super__Vector_impl_data._M_start; program != pSVar1; program = program + 1)
  {
    Add(this,program);
  }
  return;
}

Assistant:

void SamProgramChain::Add(std::vector<SamProgram>& programs)
{
    std::vector<SamProgram>::iterator pgIter = programs.begin();
    std::vector<SamProgram>::iterator pgEnd = programs.end();
    for (; pgIter != pgEnd; ++pgIter) {
        Add(*pgIter);
    }
}